

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_mristep_io.c
# Opt level: O2

int mriStep_SetDefaults(ARKodeMem ark_mem)

{
  undefined4 in_EAX;
  int iVar1;
  undefined4 in_register_00000004;
  ARKodeMRIStepMem step_mem;
  ARKodeMRIStepMem local_8;
  
  local_8 = (ARKodeMRIStepMem)CONCAT44(in_register_00000004,in_EAX);
  iVar1 = mriStep_AccessStepMem(ark_mem,"mriStep_SetDefaults",&local_8);
  if (iVar1 == 0) {
    local_8->q = 3;
    local_8->p = 0;
    local_8->predictor = 0;
    local_8->linear = 0;
    local_8->linear_timedep = 1;
    local_8->deduce_rhs = 0;
    local_8->maxcor = 3;
    local_8->nlscoef = 0.1;
    local_8->crdown = 0.3;
    local_8->rdiv = 2.3;
    local_8->dgmax = 0.2;
    local_8->msbp = 0x14;
    local_8->stages = 0;
    local_8->istage = 0;
    local_8->MRIC = (MRIStepCoupling)0x0;
    local_8->NLS = (SUNNonlinearSolver)0x0;
    local_8->convfail = 0;
    local_8->jcur = 0;
    local_8->stage_predict = (ARKStagePredictFn)0x0;
  }
  return iVar1;
}

Assistant:

int mriStep_SetDefaults(ARKodeMem ark_mem)
{
  ARKodeMRIStepMem step_mem;
  int retval;

  /* access ARKodeMRIStepMem structure */
  retval = mriStep_AccessStepMem(ark_mem, __func__, &step_mem);
  if (retval != ARK_SUCCESS) { return (retval); }

  /* Set default values for integrator optional inputs */
  step_mem->q              = 3;        /* method order */
  step_mem->p              = 0;        /* embedding order */
  step_mem->predictor      = 0;        /* trivial predictor */
  step_mem->linear         = SUNFALSE; /* nonlinear problem */
  step_mem->linear_timedep = SUNTRUE;  /* dfs/dy depends on t */
  step_mem->deduce_rhs     = SUNFALSE; /* deduce fi on result of NLS */
  step_mem->maxcor         = MAXCOR;   /* max nonlinear iters/stage */
  step_mem->nlscoef        = NLSCOEF;  /* nonlinear tolerance coefficient */
  step_mem->crdown         = CRDOWN; /* nonlinear convergence estimate coeff. */
  step_mem->rdiv           = RDIV;   /* nonlinear divergence tolerance */
  step_mem->dgmax    = DGMAX; /* max gamma change before recomputing J or P */
  step_mem->msbp     = MSBP;  /* max steps between updates to J or P */
  step_mem->stages   = 0;     /* no stages */
  step_mem->istage   = 0;     /* current stage index */
  step_mem->MRIC     = NULL;  /* no slow->fast coupling */
  step_mem->NLS      = NULL;  /* no nonlinear solver object */
  step_mem->jcur     = SUNFALSE;
  step_mem->convfail = ARK_NO_FAILURES;
  step_mem->stage_predict = NULL; /* no user-supplied stage predictor */
  return (ARK_SUCCESS);
}